

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-history.c
# Opt level: O0

void history_display(void)

{
  bool bVar1;
  _Bool _Var2;
  int iVar3;
  keypress kVar4;
  int local_124;
  size_t local_120;
  int local_114;
  size_t local_110;
  int scroll_to_3;
  size_t scroll_to_2;
  int scroll_to_1;
  size_t scroll_to;
  keycode_t kStack_bc;
  keypress ch;
  _Bool active;
  size_t i;
  char buf [120];
  int local_24;
  int page_size;
  int hgt;
  int wid;
  int row;
  size_t max_item;
  history_info *history_list_local;
  
  max_item = 0;
  _wid = history_get_list(player,(history_info **)&max_item);
  bVar1 = true;
  Term_get_size(&page_size,&local_24);
  iVar3 = local_24 + -5;
  screen_save();
LAB_00229bac:
  do {
    while( true ) {
      if (!bVar1) {
        screen_load();
        return;
      }
      Term_clear();
      print_history_header();
      stack0xffffffffffffff50 = history_display::first_item;
      for (hgt = 0; hgt <= iVar3 && stack0xffffffffffffff50 < _wid; hgt = hgt + 1) {
        strnfmt((char *)&i,0x78,"%10ld%7d\'  %s",
                (long)*(int *)(max_item + stack0xffffffffffffff50 * 0x5c + 8),
                (ulong)(uint)(*(short *)(max_item + stack0xffffffffffffff50 * 0x5c + 2) * 0x32),
                max_item + stack0xffffffffffffff50 * 0x5c + 0xc);
        _Var2 = flag_has_dbg((bitflag *)(max_item + stack0xffffffffffffff50 * 0x5c),2,4,
                             "history_list_local[i].type","HIST_ARTIFACT_LOST");
        if (_Var2) {
          my_strcat((char *)&i," (LOST)",0x78);
        }
        prt((char *)&i,hgt + L'\x02',L'\0');
        register0x00000000 = stack0xffffffffffffff50 + 1;
      }
      prt("[Arrow keys scroll, p/PgUp for previous page, n/PgDn for next page, ESC to exit.]",
          local_24 + L'\xffffffff',L'\0');
      kVar4 = inkey();
      kStack_bc = kVar4.code;
      if (kStack_bc != 0x20) break;
LAB_00229dea:
      local_110 = history_display::first_item + (long)iVar3;
      if (_wid <= local_110) {
        local_110 = _wid;
      }
      history_display::first_item = local_110;
    }
    if (kStack_bc == 0x6a) {
LAB_00229e83:
      local_120 = history_display::first_item + 1;
      if (_wid <= local_120) {
        local_120 = _wid;
      }
      history_display::first_item = local_120;
      goto LAB_00229bac;
    }
    if (kStack_bc == 0x6b) {
LAB_00229ecd:
      local_124 = (int)history_display::first_item + -1;
      if (local_124 < 0) {
        local_124 = 0;
      }
      history_display::first_item = (size_t)local_124;
    }
    else {
      if (kStack_bc == 0x6e) goto LAB_00229dea;
      if (kStack_bc == 0x70) {
LAB_00229e3a:
        local_114 = (int)history_display::first_item - iVar3;
        if (local_114 < 0) {
          local_114 = 0;
        }
        history_display::first_item = (size_t)local_114;
      }
      else {
        if (kStack_bc == 0x80) goto LAB_00229e83;
        if (kStack_bc == 0x83) goto LAB_00229ecd;
        if (kStack_bc == 0x95) goto LAB_00229e3a;
        if (kStack_bc == 0x97) goto LAB_00229dea;
        if (kStack_bc == 0xe000) {
          bVar1 = false;
        }
      }
    }
  } while( true );
}

Assistant:

void history_display(void)
{
	struct history_info *history_list_local = NULL;
	size_t max_item = history_get_list(player, &history_list_local);
	int row, wid, hgt, page_size;
	char buf[120];
	static size_t first_item = 0;
	size_t i;
	bool active = true;

	Term_get_size(&wid, &hgt);

	/* Five lines provide space for the header and footer */
	page_size = hgt - 5;

	screen_save();

	while (active)
	{
		struct keypress ch;

		Term_clear();

		/* Print everything to screen */
		print_history_header();

		row = 0;
		for (i = first_item; row <= page_size && i < max_item; i++)
		{
			strnfmt(buf, sizeof(buf), "%10ld%7d\'  %s",
				(long)history_list_local[i].turn,
				history_list_local[i].dlev * 50,
				history_list_local[i].event);

			if (hist_has(history_list_local[i].type, HIST_ARTIFACT_LOST))
				my_strcat(buf, " (LOST)", sizeof(buf));

			/* Size of header = 3 lines */
			prt(buf, row + 2, 0);
			row++;
		}
		prt("[Arrow keys scroll, p/PgUp for previous page, n/PgDn for next page, ESC to exit.]", hgt - 1, 0);

		ch = inkey();

		switch (ch.code) {
			case 'n':
			case ' ':
			case KC_PGDOWN: {
				size_t scroll_to = first_item + page_size;
				first_item = (scroll_to < max_item ? scroll_to : max_item);
				break;
			}

			case 'p':
			case KC_PGUP: {
				int scroll_to = first_item - page_size;
				first_item = (scroll_to >= 0 ? scroll_to : 0);
				break;
			}

			case 'j':
			case ARROW_DOWN: {
				size_t scroll_to = first_item + 1;
				first_item = (scroll_to < max_item ? scroll_to : max_item);
				break;
			}

			case 'k':
			case ARROW_UP: {
				int scroll_to = first_item - 1;
				first_item = (scroll_to >= 0 ? scroll_to : 0);
				break;
			}

			case ESCAPE:
				active = false;
				break;
		}
	}

	screen_load();

	return;
}